

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionDetector.hpp
# Opt level: O1

Region * __thiscall
RegionDetector::
RegionDetectorDetector<RegionDetector::Region,_RegionDetector::RegionAllocator<RegionDetector::Region>_>
::detect(RegionDetectorDetector<RegionDetector::Region,_RegionDetector::RegionAllocator<RegionDetector::Region>_>
         *this,uint8_t *pixels,uint width,uint height,
        RegionAllocator<RegionDetector::Region> *regionAllocator)

{
  byte bVar1;
  iterator iVar2;
  pointer ppVar3;
  pointer ppVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined1 *__s;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint currentPixel;
  long lVar12;
  ulong uVar13;
  byte bVar14;
  vector<std::pair<unsigned_int,unsigned_char>,std::allocator<std::pair<unsigned_int,unsigned_char>>>
  local_1908 [8];
  vector<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
  boundaryPixels [256];
  Region rootRegion;
  Region *local_a0;
  undefined1 auStack_68 [8];
  vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_> componentStack;
  pair<unsigned_int,_unsigned_char> local_40;
  uint local_34;
  
  if (height == 0 || width == 0) {
    local_a0 = (Region *)0x0;
  }
  else {
    uVar11 = height * width;
    __s = (undefined1 *)operator_new__((ulong)uVar11);
    if (uVar11 != 0) {
      memset(__s,0,(ulong)uVar11);
    }
    auStack_68 = (undefined1  [8])0x0;
    componentStack.
    super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    componentStack.
    super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>::reserve
              ((vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_> *)
               auStack_68,0x100);
    memset(local_1908,0,0x1800);
    local_34 = (uint)*pixels;
    *__s = 1;
    local_40 = (pair<unsigned_int,_unsigned_char>)
               &boundaryPixels[0xff].
                super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    boundaryPixels[0xff].
    super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (componentStack.
        super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        componentStack.
        super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::vector<RegionDetector::Region*,std::allocator<RegionDetector::Region*>>::
      _M_realloc_insert<RegionDetector::Region*>
                ((vector<RegionDetector::Region*,std::allocator<RegionDetector::Region*>> *)
                 auStack_68,
                 (iterator)
                 componentStack.
                 super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,(Region **)&local_40);
    }
    else {
      *componentStack.
       super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
       _M_impl.super__Vector_impl_data._M_start = (Region *)local_40;
      componentStack.
      super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
      _M_impl.super__Vector_impl_data._M_start =
           componentStack.
           super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
           _M_impl.super__Vector_impl_data._M_start + 1;
    }
    currentPixel = 0;
    bVar14 = 0;
LAB_0010277c:
    local_40 = (pair<unsigned_int,_unsigned_char>)
               RegionAllocator<RegionDetector::Region>::new_(regionAllocator,local_34);
    if (componentStack.
        super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        componentStack.
        super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::vector<RegionDetector::Region*,std::allocator<RegionDetector::Region*>>::
      _M_realloc_insert<RegionDetector::Region*>
                ((vector<RegionDetector::Region*,std::allocator<RegionDetector::Region*>> *)
                 auStack_68,
                 (iterator)
                 componentStack.
                 super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,(Region **)&local_40);
    }
    else {
      *componentStack.
       super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
       _M_impl.super__Vector_impl_data._M_start = (Region *)local_40;
      componentStack.
      super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
      _M_impl.super__Vector_impl_data._M_start =
           componentStack.
           super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
           _M_impl.super__Vector_impl_data._M_start + 1;
    }
    if (componentStack.
        super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
        _M_impl.super__Vector_impl_data._M_start[-1] == (Region *)0x0) {
      __assert_fail("componentStack.back() != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/RegionDetector/RegionDetector.hpp"
                    ,0x6d,
                    "REGION_TYPE *RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::detect(const uint8_t *const, const unsigned int, const unsigned int, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                   );
    }
    do {
      if (bVar14 < 4) {
        do {
          uVar7 = getNeighborIdx(this,currentPixel,width,height,(uint)bVar14);
          uVar13 = (ulong)uVar7;
          if (uVar11 <= uVar7) {
            __assert_fail("neighborIdx < width*height",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/RegionDetector/RegionDetector.hpp"
                          ,0x71,
                          "REGION_TYPE *RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::detect(const uint8_t *const, const unsigned int, const unsigned int, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                         );
          }
          bVar5 = true;
          if (__s[uVar13] == '\0') {
            __s[uVar13] = 1;
            bVar1 = pixels[uVar13];
            uVar10 = (ulong)bVar1;
            bVar5 = local_34 <= bVar1;
            if (local_34 <= bVar1) {
              local_40.second = '\0';
              local_40.first = uVar7;
              iVar2._M_current =
                   boundaryPixels[uVar10].
                   super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              if (iVar2._M_current ==
                  boundaryPixels[uVar10].
                  super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                std::
                vector<std::pair<unsigned_int,unsigned_char>,std::allocator<std::pair<unsigned_int,unsigned_char>>>
                ::_M_realloc_insert<std::pair<unsigned_int,unsigned_char>>
                          ((vector<std::pair<unsigned_int,unsigned_char>,std::allocator<std::pair<unsigned_int,unsigned_char>>>
                            *)&boundaryPixels[uVar10 - 1].
                               super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,iVar2,&local_40);
              }
              else {
                *iVar2._M_current = local_40;
                boundaryPixels[uVar10].
                super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     boundaryPixels[uVar10].
                     super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1;
              }
              goto LAB_0010288b;
            }
            uVar9 = (ulong)local_34;
            local_40.second = bVar14 + 1;
            local_40.first = currentPixel;
            iVar2._M_current =
                 boundaryPixels[uVar9].
                 super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            if (iVar2._M_current ==
                boundaryPixels[uVar9].
                super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::
              vector<std::pair<unsigned_int,unsigned_char>,std::allocator<std::pair<unsigned_int,unsigned_char>>>
              ::_M_realloc_insert<std::pair<unsigned_int,unsigned_char>>
                        ((vector<std::pair<unsigned_int,unsigned_char>,std::allocator<std::pair<unsigned_int,unsigned_char>>>
                          *)&boundaryPixels[uVar9 - 1].
                             super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,iVar2,&local_40);
            }
            else {
              *iVar2._M_current = local_40;
              boundaryPixels[uVar9].
              super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   boundaryPixels[uVar9].
                   super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
            }
            bVar14 = 0;
          }
          else {
LAB_0010288b:
            uVar13 = (ulong)currentPixel;
            uVar10 = (ulong)local_34;
          }
          local_34 = (uint)uVar10;
          currentPixel = (uint)uVar13;
          if (!bVar5) goto LAB_0010277c;
          bVar14 = bVar14 + 1;
        } while (bVar14 < 4);
      }
      else {
        uVar13 = (ulong)currentPixel;
        uVar10 = (ulong)local_34;
      }
      currentPixel = (uint)uVar13;
      if (auStack_68 ==
          (undefined1  [8])
          componentStack.
          super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        __assert_fail("!componentStack.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/RegionDetector/RegionDetector.hpp"
                      ,0x84,
                      "REGION_TYPE *RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::detect(const uint8_t *const, const unsigned int, const unsigned int, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                     );
      }
      Region::accumulate(componentStack.
                         super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1],currentPixel,
                         (uint)pixels[uVar13],width);
      uVar7 = (uint)uVar10;
      uVar6 = uVar7 + 1;
      if (uVar7 + 1 < 0x101) {
        uVar6 = 0x100;
      }
      do {
        ppVar3 = boundaryPixels[uVar10 - 1].
                 super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        ppVar4 = boundaryPixels[uVar10].
                 super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (ppVar3 != ppVar4) {
          currentPixel = ppVar4[-1].first;
          bVar14 = ppVar4[-1].second;
          boundaryPixels[uVar10].
          super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
          ._M_impl.super__Vector_impl_data._M_start = ppVar4 + -1;
          bVar1 = pixels[currentPixel];
          local_34 = (uint)bVar1;
          if (uVar7 != bVar1) {
            if (bVar1 <= uVar7) {
              __assert_fail("currentLevel > previousLevel",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/RegionDetector/RegionDetector.hpp"
                            ,0x9f,
                            "REGION_TYPE *RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::detect(const uint8_t *const, const unsigned int, const unsigned int, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                           );
            }
            processStack(this,(uint)bVar1,
                         (vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                          *)auStack_68,regionAllocator);
          }
          goto LAB_001029cd;
        }
        uVar8 = (int)uVar10 + 1;
        uVar10 = (ulong)uVar8;
      } while (uVar6 != uVar8);
      if ((long)componentStack.
                super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                ._M_impl.super__Vector_impl_data._M_start - (long)auStack_68 != 0x10) {
        __assert_fail("componentStack.size() == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/RegionDetector/RegionDetector.hpp"
                      ,0x8d,
                      "REGION_TYPE *RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::detect(const uint8_t *const, const unsigned int, const unsigned int, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                     );
      }
      if (uVar11 != 0) {
        uVar10 = 0;
        do {
          if (__s[uVar10] == '\0') {
            __assert_fail("accessible[i] == true",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/RegionDetector/RegionDetector.hpp"
                          ,0xaa,
                          "REGION_TYPE *RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::detect(const uint8_t *const, const unsigned int, const unsigned int, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                         );
          }
          uVar10 = uVar10 + 1;
        } while (uVar11 != uVar10);
      }
      local_34 = uVar6;
      operator_delete__(__s);
      local_a0 = componentStack.
                 super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1];
LAB_001029cd:
    } while (ppVar3 != ppVar4);
    if (boundaryPixels[0xff].
        super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(boundaryPixels[0xff].
                      super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    lVar12 = 0x17e8;
    do {
      if (*(void **)(local_1908 + lVar12) != (void *)0x0) {
        operator_delete(*(void **)(local_1908 + lVar12));
      }
      lVar12 = lVar12 + -0x18;
    } while (lVar12 != -0x18);
    if (auStack_68 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_68);
    }
  }
  return local_a0;
}

Assistant:

REGION_TYPE* detect(uint8_t const * const pixels, const unsigned int width, const unsigned int height, REGION_ALLOCATOR_TYPE *regionAllocator) {

			// pixel index first, edge second
			typedef std::pair<unsigned int, unsigned char> PixelAndEdgeType;

			if (width == 0 || height == 0) {
				return nullptr;
			}

			const int N_NEIGHBORS = 4;

			// true if the pixel has already been accessed
			bool * const accessible = new bool[width*height];
			assert(accessible);
			for (unsigned int i = 0; i < width*height; i++) {
				accessible[i] = false;
			}

			std::vector<REGION_TYPE*> componentStack;
			componentStack.reserve(256);

			std::vector<PixelAndEdgeType> boundaryPixels[256];

			unsigned int currentIdx = 0;
			unsigned int currentLevel = pixels[currentIdx];

			accessible[currentIdx] = true;
			REGION_TYPE rootRegion(256);
			componentStack.push_back(&rootRegion);

			unsigned char currentEdge = 0;

		push_empty_component:
			componentStack.push_back(regionAllocator->new_(currentLevel));
			assert(componentStack.back() != nullptr);
		check_neighbors:
			for (; currentEdge < N_NEIGHBORS; currentEdge++) {
				const unsigned int neighborIdx = getNeighborIdx(currentIdx, width, height, currentEdge);
				assert(neighborIdx < width*height);
				if (!accessible[neighborIdx]) {
					accessible[neighborIdx] = true;
					unsigned int neighborLevel = pixels[neighborIdx];
					if (neighborLevel < currentLevel) {
						// neighbor is smaller, push this pixel back
						boundaryPixels[currentLevel].push_back(PixelAndEdgeType(currentIdx, currentEdge + 1));
						currentIdx = neighborIdx;
						currentLevel = neighborLevel;
						currentEdge = 0;
						goto push_empty_component;
					}
					else
					{
						boundaryPixels[neighborLevel].push_back(PixelAndEdgeType(neighborIdx, 0));
					}
				}
			}

			assert(!componentStack.empty());
			auto comp = componentStack.back();
			comp->accumulate(currentIdx, pixels[currentIdx], width);
			const unsigned int previousLevel = currentLevel;

			while (boundaryPixels[currentLevel].empty()) {
				currentLevel++;

				if (currentLevel > 255) {
					assert(componentStack.size() == 2);
					goto done;
				}
			}

			{
				PixelAndEdgeType pe = boundaryPixels[currentLevel].back();
				currentIdx = pe.first;
				currentEdge = pe.second;
			}
			boundaryPixels[currentLevel].pop_back();

			currentLevel = pixels[currentIdx];

			{
				unsigned int newPixelGrayLevel = pixels[currentIdx];

				if (currentLevel != previousLevel) {
					assert(currentLevel > previousLevel);
					currentLevel = newPixelGrayLevel;
					processStack(newPixelGrayLevel, componentStack, regionAllocator);
				}
			}
			goto check_neighbors;


		done:
			// all pixels must be accessible in the end
			for (unsigned int i = 0; i < width*height; i++) {
				assert(accessible[i] == true);
			}

			delete[] accessible;
			return componentStack.back();
		}